

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

void x86TestEncoding(uchar *codeLaunchHeader)

{
  undefined8 *puVar1;
  uchar *puVar2;
  byte *pbVar3;
  x86XmmReg reg1;
  x86Reg xVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  int iVar33;
  int iVar34;
  int iVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  uchar *stream;
  x86Instruction *start_23;
  long lVar43;
  long lVar44;
  long lVar45;
  ulong uVar46;
  uchar *puVar47;
  uchar *puVar48;
  size_t sVar49;
  long lVar50;
  long lVar51;
  uint uVar52;
  uchar *start_2;
  long lVar53;
  ulong uVar54;
  uchar *start;
  uchar *puVar55;
  uchar *puVar56;
  x86Instruction *this;
  uchar *start_22;
  uchar *puVar57;
  long lVar58;
  byte bVar59;
  uchar *start_10;
  byte *pbVar60;
  byte *pbVar61;
  x86Reg *pxVar62;
  uint uVar63;
  uchar *start_8;
  long lVar64;
  byte *pbVar65;
  int iVar66;
  uchar *start_15;
  long lVar67;
  uchar *start_18;
  uchar *start_11;
  uchar *start_1;
  uchar *start_14;
  uchar *start_5;
  OutputContext output;
  CodeGenGenericContext ctx;
  char instBuf [128];
  CodeGenRegVmStateContext vmState;
  int local_ff8;
  int local_f98;
  OutputContext local_ed0;
  CodeGenGenericContext local_c90;
  char local_2c8 [136];
  CodeGenRegVmStateContext local_240;
  
  stream = (uchar *)operator_new__(0x200000);
  CodeGenGenericContext::CodeGenGenericContext(&local_c90);
  start_23 = (x86Instruction *)operator_new__(0x1400000);
  lVar50 = 0;
  do {
    *(undefined4 *)((long)&start_23->name + lVar50) = 0;
    *(undefined4 *)((long)&(start_23->argA).type + lVar50) = 0;
    puVar1 = (undefined8 *)((long)&(start_23->argB).field_1 + lVar50);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)&(start_23->argB).ptrMult + lVar50) = 0;
    puVar1 = (undefined8 *)((long)&(start_23->argA).field_1 + lVar50);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&(start_23->argA).ptrIndex + lVar50);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar50 = lVar50 + 0x50;
  } while (lVar50 != 0x1400000);
  NULLC::fillMemory(start_23,0,0x1400000);
  local_c90.x86Op = start_23;
  local_c90.x86Base = start_23;
  iVar10 = TestRptrXmmEncoding(&local_c90,stream,o_movss,x86MOVSS,1);
  puVar57 = stream + iVar10;
  iVar11 = TestXmmXmmEncoding(&local_c90,puVar57,o_movsd,x86MOVSD);
  lVar43 = (long)iVar11;
  puVar55 = puVar57 + lVar43;
  iVar12 = TestRptrXmmEncoding(&local_c90,puVar55,o_movsd,x86MOVSD,2);
  puVar55 = puVar55 + iVar12;
  iVar13 = TestXmmRptrEncoding(&local_c90,puVar55,o_movsd,x86MOVSD,2);
  puVar55 = puVar55 + iVar13;
  iVar14 = TestRegXmmEncoding(&local_c90,puVar55,o_movd,x86MOVD);
  lVar44 = (long)iVar14;
  puVar55 = puVar55 + lVar44;
  iVar15 = TestRegRptrEncoding(&local_c90,puVar55,o_movsxd,x86MOVSXD,1);
  puVar55 = puVar55 + iVar15;
  iVar16 = TestXmmRptrEncoding(&local_c90,puVar55,o_cvtss2sd,x86CVTSS2SD,1);
  puVar55 = puVar55 + iVar16;
  iVar17 = TestXmmXmmEncoding(&local_c90,puVar55,o_cvtss2sd,x86CVTSS2SD);
  lVar45 = (long)iVar17;
  puVar55 = puVar55 + lVar45;
  iVar18 = TestXmmRptrEncoding(&local_c90,puVar55,o_cvtsd2ss,x86CVTSD2SS,2);
  puVar55 = puVar55 + iVar18;
  iVar19 = TestXmmXmmEncoding(&local_c90,puVar55,o_cvtsd2ss,x86CVTSD2SS);
  lVar64 = (long)iVar19;
  puVar55 = puVar55 + lVar64;
  iVar20 = TestRegRptrEncoding(&local_c90,puVar55,o_cvttsd2si,x86CVTTSD2SI,2);
  puVar55 = puVar55 + iVar20;
  iVar21 = TestRegRptrEncoding(&local_c90,puVar55,o_cvttsd2si64,x64CVTTSD2SI,2);
  puVar55 = puVar55 + iVar21;
  iVar22 = TestXmmRptrEncoding(&local_c90,puVar55,o_cvtsi2sd,x86CVTSI2SD,1);
  lVar53 = (long)iVar22;
  puVar55 = puVar55 + lVar53;
  iVar23 = TestXmmRegEncoding(&local_c90,puVar55,o_cvtsi2sd,x86CVTSI2SD);
  lVar51 = (long)iVar23;
  puVar55 = puVar55 + lVar51;
  lVar50 = (long)iVar21 +
           (long)iVar20 + (long)iVar18 + (long)iVar16 + (long)iVar15 + (long)iVar13 + (long)iVar12;
  uVar46 = 0;
  puVar56 = puVar55;
  do {
    reg1 = testXmmRegs[uVar46];
    local_ff8._0_1_ = (char)reg1 * '\b';
    lVar67 = (long)puVar56 -
             (long)(puVar57 + lVar51 + lVar45 + lVar64 + lVar53 + lVar44 + lVar43 + lVar50);
    uVar54 = 0xfffffffffffffffb;
    lVar58 = 0;
    do {
      xVar4 = *(x86Reg *)((long)testRegs + lVar58);
      EMIT_OP_REG_REG(&local_c90,o_cvtsi2sd64,reg1,xVar4);
      *puVar56 = 0xf2;
      puVar56[1] = uVar54 < 4 | (1 < uVar46) << 2 | 0x48U;
      puVar56[2] = '\x0f';
      puVar56[3] = '*';
      puVar56[4] = regCode[xVar4] | (byte)local_ff8 | 0xc0;
      puVar56 = puVar56 + 5;
      lVar67 = lVar67 + 5;
      uVar54 = uVar54 + 1;
      lVar58 = lVar58 + 4;
    } while (lVar58 != 0x24);
    uVar46 = uVar46 + 1;
  } while (uVar46 != 6);
  iVar66 = (int)lVar67;
  puVar55 = puVar55 + iVar66;
  iVar24 = TestXmmXmmEncoding(&local_c90,puVar55,o_addsd,x86ADDSD);
  puVar55 = puVar55 + iVar24;
  iVar25 = TestXmmRptrEncoding(&local_c90,puVar55,o_addsd,x86ADDSD,3);
  puVar55 = puVar55 + iVar25;
  iVar26 = TestXmmXmmEncoding(&local_c90,puVar55,o_subsd,x86SUBSD);
  puVar55 = puVar55 + iVar26;
  iVar27 = TestXmmRptrEncoding(&local_c90,puVar55,o_subsd,x86SUBSD,3);
  puVar55 = puVar55 + iVar27;
  iVar28 = TestXmmXmmEncoding(&local_c90,puVar55,o_mulsd,x86MULSD);
  puVar55 = puVar55 + iVar28;
  iVar29 = TestXmmRptrEncoding(&local_c90,puVar55,o_mulsd,x86MULSD,3);
  puVar55 = puVar55 + iVar29;
  iVar30 = TestXmmXmmEncoding(&local_c90,puVar55,o_divsd,x86DIVSD);
  puVar55 = puVar55 + iVar30;
  iVar31 = TestXmmRptrEncoding(&local_c90,puVar55,o_divsd,x86DIVSD,3);
  puVar55 = puVar55 + iVar31;
  iVar32 = TestXmmXmmEncoding(&local_c90,puVar55,o_sqrtsd,x86SQRTSD);
  puVar55 = puVar55 + iVar32;
  iVar33 = TestXmmXmmEncoding(&local_c90,puVar55,o_cmpeqsd,x86CMPEQSD);
  puVar55 = puVar55 + iVar33;
  iVar34 = TestXmmXmmEncoding(&local_c90,puVar55,o_cmpltsd,x86CMPLTSD);
  puVar55 = puVar55 + iVar34;
  iVar35 = TestXmmXmmEncoding(&local_c90,puVar55,o_cmplesd,x86CMPLESD);
  puVar55 = puVar55 + iVar35;
  iVar36 = TestXmmXmmEncoding(&local_c90,puVar55,o_cmpneqsd,x86CMPNEQSD);
  iVar37 = TestRptrEncoding(&local_c90,puVar55 + iVar36,o_push,x86PUSH,2);
  puVar56 = puVar55 + iVar36 + iVar37;
  uVar46 = 0xfffffffffffffffb;
  lVar67 = 0;
  puVar55 = puVar56;
  do {
    puVar47 = puVar55;
    xVar4 = *(x86Reg *)((long)testRegs + lVar67);
    EMIT_OP_REG(&local_c90,o_push,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *puVar47 = 'A';
    }
    puVar47[bVar5] = regCode[xVar4] + 'P';
    uVar46 = uVar46 + 1;
    lVar67 = lVar67 + 4;
    puVar55 = puVar47 + (int)(bVar5 + 1);
  } while (lVar67 != 0x24);
  lVar67 = (long)((int)(puVar47 + (int)(bVar5 + 1)) - (int)puVar56);
  EMIT_OP_NUM(&local_c90,o_push,4);
  puVar55 = puVar56 + lVar67;
  puVar55[0] = 'j';
  puVar55[1] = '\x04';
  EMIT_OP_NUM(&local_c90,o_push,0x400);
  puVar55[2] = 'h';
  puVar55[3] = '\0';
  puVar55[4] = '\x04';
  puVar55[5] = '\0';
  puVar55[6] = '\0';
  iVar38 = TestRptrEncoding(&local_c90,puVar55 + 7,o_pop,x86POP,2);
  puVar56 = puVar56 + iVar38 + lVar67 + 7;
  uVar46 = 0xfffffffffffffffb;
  lVar67 = 0;
  puVar55 = puVar56;
  do {
    puVar48 = puVar55;
    xVar4 = *(x86Reg *)((long)testRegs + lVar67);
    EMIT_OP_REG(&local_c90,o_pop,xVar4);
    bVar6 = uVar46 < 4;
    if (bVar6) {
      *puVar48 = 'A';
    }
    puVar48[bVar6] = regCode[xVar4] + 'X';
    uVar46 = uVar46 + 1;
    lVar67 = lVar67 + 4;
    puVar55 = puVar48 + (int)(bVar6 + 1);
  } while (lVar67 != 0x24);
  puVar56 = puVar56 + ((int)(puVar48 + (int)(bVar6 + 1)) - (int)puVar56);
  uVar46 = 0xfffffffffffffffb;
  lVar67 = 0;
  puVar55 = puVar56;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar67);
    EMIT_OP_REG_NUM(&local_c90,o_mov,xVar4,4);
    bVar7 = uVar46 < 4;
    if (bVar7) {
      *puVar55 = 'A';
    }
    iVar9 = (int)puVar55;
    puVar55[bVar7] = regCode[xVar4] + 0xb8;
    puVar2 = puVar55 + (ulong)bVar7 + 1;
    puVar2[0] = '\x04';
    puVar2[1] = '\0';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar55 = puVar55 + (int)(bVar7 + 5);
    EMIT_OP_REG_NUM(&local_c90,o_mov,xVar4,0x400);
    bVar8 = uVar46 < 4;
    if (bVar8) {
      *puVar55 = 'A';
    }
    puVar55[bVar8] = regCode[xVar4] + 0xb8;
    puVar2 = puVar55 + (ulong)bVar8 + 1;
    puVar2[0] = '\0';
    puVar2[1] = '\x04';
    puVar2[2] = '\0';
    puVar2[3] = '\0';
    puVar55 = puVar55 + (int)(bVar8 + 5);
    uVar46 = uVar46 + 1;
    lVar67 = lVar67 + 4;
  } while (lVar67 != 0x24);
  puVar56 = puVar56 + ((int)puVar55 - (int)puVar56);
  iVar39 = TestRegRegEncoding(&local_c90,puVar56,o_mov,x86MOV);
  puVar56 = puVar56 + iVar39;
  iVar40 = TestRegRptrEncoding(&local_c90,puVar56,o_mov,x86MOV,1);
  puVar56 = puVar56 + iVar40;
  iVar41 = TestRptrRegEncoding(&local_c90,puVar56,o_mov,x86MOV,1);
  iVar42 = TestRptrNumEncoding(&local_c90,puVar56 + iVar41,o_mov,x86MOV,1);
  puVar57 = puVar57 + (long)iVar25 + (long)iVar27 + (long)iVar29 + (long)iVar31 + (long)iVar37 +
                      lVar53 + lVar50;
  iVar11 = iVar24 + iVar17 + iVar11 + iVar14 + iVar19 + iVar23;
  iVar14 = (int)puVar47 +
           ((uint)bVar5 -
           (iVar34 + iVar35 + iVar36 + iVar66 +
           iVar11 + iVar26 + iVar28 + iVar30 + iVar32 + iVar33 + (int)puVar57)) + 1;
  local_f98 = (int)stream;
  iVar11 = iVar26 + iVar28 + iVar30 + iVar32 + iVar33 + iVar34 + iVar35 +
           iVar25 + iVar22 + iVar20 + iVar21 +
           iVar15 + iVar16 + iVar18 + iVar12 + iVar13 + iVar10 + local_f98 + iVar38 +
           iVar37 + iVar31 + iVar29 + iVar27 + iVar11 + iVar36 + iVar66 + iVar14;
  iVar10 = ((uint)bVar6 - iVar11) + (int)puVar48 + -6;
  pbVar60 = puVar56 + iVar41 + iVar42;
  lVar53 = 0;
  lVar50 = -8 - (long)(puVar57 +
                      (long)iVar24 + (long)iVar26 + (long)iVar28 + (long)iVar30 + (long)iVar32 +
                      (long)iVar33 + (long)iVar34 + (long)iVar35 + (long)iVar36 + (long)iVar39 +
                      (long)iVar66 + (long)iVar14 + (long)iVar10 +
                      (long)(int)(iVar9 + (uint)bVar8 + ((uint)bVar7 - (iVar11 + iVar10)) + 3) +
                      lVar51 + lVar64 + lVar45 + (long)iVar42 +
                                                 lVar44 + lVar43 + (long)iVar41 +
                                                                   (long)iVar40 + (long)iVar38);
  lVar43 = -0xf - (long)(puVar57 +
                        (long)iVar24 + (long)iVar26 + (long)iVar28 + (long)iVar30 + (long)iVar32 +
                        (long)iVar33 + (long)iVar34 + (long)iVar35 + (long)iVar36 + (long)iVar39 +
                        (long)iVar66 + (long)iVar14 + (long)iVar10 +
                        (long)(int)(iVar9 + (uint)bVar8 + ((uint)bVar7 - (iVar11 + iVar10)) + 3) +
                        lVar51 + lVar64 + lVar45 + (long)iVar42 +
                                                   lVar44 + lVar43 + (long)iVar41 +
                                                                     (long)iVar40 + (long)iVar38);
  pbVar61 = pbVar60;
  do {
    lVar45 = lVar43;
    lVar44 = lVar50;
    xVar4 = testRegs[lVar53];
    EMIT_OP_REG_NUM64(&local_c90,o_mov64,xVar4,0x1122aabbccddeeff);
    *pbVar61 = lVar53 - 5U < 4 | 0x48;
    pbVar61[1] = regCode[xVar4] + 0xb8;
    pbVar61[2] = 0xff;
    pbVar61[3] = 0xee;
    pbVar61[4] = 0xdd;
    pbVar61[5] = 0xcc;
    pbVar61[6] = 0xbb;
    pbVar61[7] = 0xaa;
    pbVar61[8] = 0x22;
    pbVar61[9] = 0x11;
    pbVar61 = pbVar61 + 10;
    lVar53 = lVar53 + 1;
    lVar50 = lVar44 + -10;
    lVar43 = lVar45 + -10;
  } while (lVar53 != 9);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_mov64,x64MOV);
  pbVar60 = pbVar60 + iVar10;
  iVar11 = TestRegRptrEncoding(&local_c90,pbVar60,o_mov64,x86MOV,2);
  pbVar60 = pbVar60 + iVar11;
  iVar12 = TestRptrRegEncoding(&local_c90,pbVar60,o_mov64,x86MOV,2);
  pbVar60 = pbVar60 + iVar12;
  iVar13 = TestRptrNumEncoding(&local_c90,pbVar60,o_mov64,x86MOV,2);
  pbVar60 = pbVar60 + iVar13;
  iVar14 = TestRegRptrEncoding(&local_c90,pbVar60,o_lea,x86LEA,3);
  iVar15 = TestRptrEncoding(&local_c90,pbVar60 + iVar14,o_neg,x86NEG,1);
  pbVar60 = pbVar60 + iVar14 + iVar15;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_neg,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    iVar16 = (int)pbVar61;
    pbVar61[bVar5] = 0xf7;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd8;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  iVar17 = TestRptrEncoding(&local_c90,pbVar60 + ((int)pbVar61 - (int)pbVar60),o_neg64,x86NEG,2);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60) + iVar17;
  lVar50 = -((long)iVar14 + (long)iVar15 + (long)iVar11 + (long)iVar12 + (long)iVar13);
  local_ff8 = (int)lVar45;
  lVar50 = (((lVar50 - iVar17) - (long)iVar10) + lVar44) -
           (long)(int)(iVar16 + (uint)bVar5 + local_ff8 + ((int)lVar50 - iVar10));
  lVar43 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = testRegs[lVar43];
    EMIT_OP_REG(&local_c90,o_neg64,xVar4);
    *pbVar61 = lVar43 - 5U < 4 | 0x48;
    pbVar61[1] = 0xf7;
    pbVar61[2] = regCode[xVar4] | 0xd8;
    pbVar61 = pbVar61 + 3;
    lVar43 = lVar43 + 1;
    lVar50 = lVar50 + -3;
  } while (lVar43 != 9);
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60 + ((int)pbVar61 - (int)pbVar60),o_add,x86ADD);
  pbVar65 = pbVar60 + ((int)pbVar61 - (int)pbVar60) + iVar10;
  uVar46 = 0xfffffffffffffffb;
  lVar43 = 0;
  pbVar60 = pbVar65;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar43);
    EMIT_OP_REG_NUM(&local_c90,o_add,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar60 = 0x41;
    }
    iVar11 = (int)pbVar60;
    pbVar60[bVar5] = 0x83;
    pbVar60[(ulong)bVar5 + 1] = regCode[xVar4] | 0xc0;
    pbVar60[(ulong)bVar5 + 2] = 4;
    pbVar60 = pbVar60 + (int)(bVar5 + 3);
    EMIT_OP_REG_NUM(&local_c90,o_add,xVar4,0x400);
    bVar6 = uVar46 < 4;
    if (bVar6) {
      *pbVar60 = 0x41;
    }
    pbVar60[bVar6] = 0x81;
    pbVar60[(ulong)bVar6 + 1] = regCode[xVar4] | 0xc0;
    pbVar3 = pbVar60 + (ulong)bVar6 + 2;
    pbVar3[0] = 0;
    pbVar3[1] = 4;
    pbVar3[2] = 0;
    pbVar3[3] = 0;
    pbVar60 = pbVar60 + (int)(bVar6 + 6);
    uVar46 = uVar46 + 1;
    lVar43 = lVar43 + 4;
  } while (lVar43 != 0x24);
  pbVar65 = pbVar65 + ((int)pbVar60 - (int)pbVar65);
  iVar12 = TestRegRptrEncoding(&local_c90,pbVar65,o_add,x86ADD,1);
  pbVar65 = pbVar65 + iVar12;
  iVar13 = TestRptrRegEncoding(&local_c90,pbVar65,o_add,x86ADD,1);
  pbVar65 = pbVar65 + iVar13;
  iVar14 = TestRptrNumEncoding(&local_c90,pbVar65,o_add,x86ADD,1);
  pbVar65 = pbVar65 + iVar14;
  iVar15 = TestRegRegEncoding(&local_c90,pbVar65,o_add64,x64ADD);
  pbVar65 = pbVar65 + iVar15;
  pbVar61 = pbVar61 + (long)iVar14 + (long)iVar15 +
                      (long)iVar13 +
                      (long)iVar12 +
                      (long)(int)(iVar11 + (uint)bVar6 + (uint)bVar5 + ((int)lVar50 - iVar10)) +
                      (long)iVar10;
  uVar46 = 0xfffffffffffffffb;
  pxVar62 = testRegs;
  lVar50 = 0;
  do {
    lVar43 = lVar50;
    xVar4 = *pxVar62;
    EMIT_OP_REG_NUM(&local_c90,o_add64,xVar4,4);
    bVar59 = uVar46 < 4 | 0x48;
    pbVar61[lVar43] = bVar59;
    pbVar61[lVar43 + 1] = 0x83;
    pbVar61[lVar43 + 2] = regCode[xVar4] | 0xc0;
    pbVar61[lVar43 + 3] = 4;
    EMIT_OP_REG_NUM(&local_c90,o_add64,xVar4,0x400);
    pbVar61[lVar43 + 4] = bVar59;
    pbVar61[lVar43 + 5] = 0x81;
    pbVar61[lVar43 + 6] = regCode[xVar4] | 0xc0;
    pbVar60 = pbVar61 + lVar43 + 7;
    pbVar60[0] = 0;
    pbVar60[1] = 4;
    pbVar60[2] = 0;
    pbVar60[3] = 0;
    uVar46 = uVar46 + 1;
    pxVar62 = pxVar62 + 1;
    lVar50 = lVar43 + 0xb;
  } while (lVar43 + 0xb != 99);
  pbVar65 = pbVar65 + (((int)pbVar61 + (int)lVar43 + 0xb) - (int)pbVar65);
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar65,o_add64,x86ADD,2);
  pbVar65 = pbVar65 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar65,o_add64,x86ADD,2);
  pbVar65 = pbVar65 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar65,o_add64,x86ADD,2);
  iVar11 = TestRegRegEncoding(&local_c90,pbVar65 + iVar10,o_adc,x86ADC);
  pbVar60 = pbVar65 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_adc,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0x83;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd0;
    pbVar61[(ulong)bVar5 + 2] = 4;
    pbVar61 = pbVar61 + (int)(bVar5 + 3);
    EMIT_OP_REG_NUM(&local_c90,o_adc,xVar4,0x400);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0x81;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd0;
    pbVar65 = pbVar61 + (ulong)bVar5 + 2;
    pbVar65[0] = 0;
    pbVar65[1] = 4;
    pbVar65[2] = 0;
    pbVar65[3] = 0;
    pbVar61 = pbVar61 + (int)(bVar5 + 6);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_adc,x86ADC,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_adc,x86ADC,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_sub,x86SUB);
  pbVar60 = pbVar60 + iVar10;
  lVar50 = 0;
  iVar10 = TestRegNumEncoding(&local_c90,pbVar60,o_sub,x86SUB,false);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_sub,x86SUB,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_sub,x86SUB,1);
  iVar11 = TestRegRegEncoding(&local_c90,pbVar60 + iVar10,o_sub64,x64SUB);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_sub64,xVar4,4);
    bVar59 = uVar46 < 4 | 0x48;
    *pbVar61 = bVar59;
    pbVar61[1] = 0x83;
    pbVar61[2] = regCode[xVar4] | 0xe8;
    pbVar61[3] = 4;
    EMIT_OP_REG_NUM(&local_c90,o_sub64,xVar4,0x400);
    pbVar61[4] = bVar59;
    pbVar61[5] = 0x81;
    pbVar61[6] = regCode[xVar4] | 0xe8;
    pbVar61[7] = 0;
    pbVar61[8] = 4;
    pbVar61[9] = 0;
    pbVar61[10] = 0;
    pbVar61 = pbVar61 + 0xb;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_sub64,x86SUB,2);
  iVar11 = TestRptrNumEncoding(&local_c90,pbVar60 + iVar10,o_sub64,x86SUB,2);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_sbb,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0x83;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd8;
    pbVar61[(ulong)bVar5 + 2] = 4;
    pbVar61 = pbVar61 + (int)(bVar5 + 3);
    EMIT_OP_REG_NUM(&local_c90,o_sbb,xVar4,0x400);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0x81;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd8;
    pbVar65 = pbVar61 + (ulong)bVar5 + 2;
    pbVar65[0] = 0;
    pbVar65[1] = 4;
    pbVar65[2] = 0;
    pbVar65[3] = 0;
    pbVar61 = pbVar61 + (int)(bVar5 + 6);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_sbb,x86SBB);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_sbb,x86SBB,1);
  iVar11 = TestRptrNumEncoding(&local_c90,pbVar60 + iVar10,o_sbb,x86SBB,1);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_imul,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xf7;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xe8;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_imul,x86IMUL);
  pbVar60 = pbVar60 + iVar10;
  lVar50 = 0;
  iVar10 = TestRegNumEncoding(&local_c90,pbVar60,o_imul,x86IMUL,false);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_imul,x86IMUL,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_imul64,x64IMUL);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_imul64,x86IMUL,2);
  iVar11 = TestRptrEncoding(&local_c90,pbVar60 + iVar10,o_idiv,x86IDIV,1);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_idiv,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xf7;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xf8;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  iVar10 = TestRptrEncoding(&local_c90,pbVar60 + ((int)pbVar61 - (int)pbVar60),o_idiv64,x86IDIV,2);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60) + iVar10;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_idiv64,xVar4);
    *pbVar61 = uVar46 < 4 | 0x48;
    pbVar61[1] = 0xf7;
    pbVar61[2] = regCode[xVar4] | 0xf8;
    pbVar61 = pbVar61 + 3;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_shl,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xc1;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xe0;
    pbVar61[(ulong)bVar5 + 2] = 4;
    pbVar61 = pbVar61 + (int)(bVar5 + 3);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60 + ((int)pbVar61 - (int)pbVar60),o_shl,x86SHL,1);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60) + iVar10;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_sal,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xd3;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xe0;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_sal,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xc1;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xe0;
    pbVar61[(ulong)bVar5 + 2] = 4;
    pbVar61 = pbVar61 + (int)(bVar5 + 3);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_sal64,xVar4);
    *pbVar61 = uVar46 < 4 | 0x48;
    pbVar61[1] = 0xd3;
    pbVar61[2] = regCode[xVar4] | 0xe0;
    pbVar61 = pbVar61 + 3;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_sal64,xVar4,4);
    *pbVar61 = uVar46 < 4 | 0x48;
    pbVar61[1] = 0xc1;
    pbVar61[2] = regCode[xVar4] | 0xe0;
    pbVar61[3] = 4;
    pbVar61 = pbVar61 + 4;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_sar,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xd3;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xf8;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_sar,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xc1;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xf8;
    pbVar61[(ulong)bVar5 + 2] = 4;
    pbVar61 = pbVar61 + (int)(bVar5 + 3);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_sar64,xVar4);
    *pbVar61 = uVar46 < 4 | 0x48;
    pbVar61[1] = 0xd3;
    pbVar61[2] = regCode[xVar4] | 0xf8;
    pbVar61 = pbVar61 + 3;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_sar64,xVar4,4);
    *pbVar61 = uVar46 < 4 | 0x48;
    pbVar61[1] = 0xc1;
    pbVar61[2] = regCode[xVar4] | 0xf8;
    pbVar61[3] = 4;
    pbVar61 = pbVar61 + 4;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  iVar10 = TestRptrEncoding(&local_c90,pbVar60 + ((int)pbVar61 - (int)pbVar60),o_not,x86NOT,1);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60) + iVar10;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_not,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xf7;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd0;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  iVar10 = TestRptrEncoding(&local_c90,pbVar60 + ((int)pbVar61 - (int)pbVar60),o_not64,x86NOT,2);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60) + iVar10;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_not64,xVar4);
    *pbVar61 = uVar46 < 4 | 0x48;
    pbVar61[1] = 0xf7;
    pbVar61[2] = regCode[xVar4] | 0xd0;
    pbVar61 = pbVar61 + 3;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_and,x86AND);
  pbVar60 = pbVar60 + iVar10;
  lVar50 = 0;
  iVar10 = TestRegNumEncoding(&local_c90,pbVar60,o_and,x86AND,false);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_and,x86AND,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_and,x86AND,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_and,x86AND,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_and64,x64AND);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_and64,x86AND,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_and64,x86AND,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_and64,x86AND,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_or,x86OR);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegNumEncoding(&local_c90,pbVar60,o_or,x86OR,false);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_or,x86OR,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_or,x86OR,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_or,x86OR,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_or64,x64OR);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_or64,x86OR,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_or64,x86OR,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_or64,x86OR,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_xor,x86XOR);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegNumEncoding(&local_c90,pbVar60,o_xor,x86XOR,false);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_xor,x86XOR,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_xor,x86XOR,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_xor,x86XOR,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRegEncoding(&local_c90,pbVar60,o_xor64,x64XOR);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_xor64,x86XOR,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_xor64,x86XOR,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_xor64,x86XOR,2);
  iVar11 = TestRegRegEncoding(&local_c90,pbVar60 + iVar10,o_cmp,x86CMP);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_cmp,xVar4,4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0x83;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xf8;
    pbVar61[(ulong)bVar5 + 2] = 4;
    pbVar61 = pbVar61 + (int)(bVar5 + 3);
    EMIT_OP_REG_NUM(&local_c90,o_cmp,xVar4,0x400);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0x81;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xf8;
    pbVar65 = pbVar61 + (ulong)bVar5 + 2;
    pbVar65[0] = 0;
    pbVar65[1] = 4;
    pbVar65[2] = 0;
    pbVar65[3] = 0;
    pbVar61 = pbVar61 + (int)(bVar5 + 6);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_cmp,x86CMP,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_cmp,x86CMP,1);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_cmp,x86CMP,1);
  iVar11 = TestRegRegEncoding(&local_c90,pbVar60 + iVar10,o_cmp64,x64CMP);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG_NUM(&local_c90,o_cmp64,xVar4,4);
    bVar59 = uVar46 < 4 | 0x48;
    *pbVar61 = bVar59;
    pbVar61[1] = 0x83;
    pbVar61[2] = regCode[xVar4] | 0xf8;
    pbVar61[3] = 4;
    EMIT_OP_REG_NUM(&local_c90,o_cmp64,xVar4,0x400);
    pbVar61[4] = bVar59;
    pbVar61[5] = 0x81;
    pbVar61[6] = regCode[xVar4] | 0xf8;
    pbVar61[7] = 0;
    pbVar61[8] = 4;
    pbVar61[9] = 0;
    pbVar61[10] = 0;
    pbVar61 = pbVar61 + 0xb;
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRegRptrEncoding(&local_c90,pbVar60,o_cmp64,x86CMP,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrRegEncoding(&local_c90,pbVar60,o_cmp64,x86CMP,2);
  pbVar60 = pbVar60 + iVar10;
  iVar10 = TestRptrNumEncoding(&local_c90,pbVar60,o_cmp64,x86CMP,2);
  iVar11 = TestRegRegEncoding(&local_c90,pbVar60 + iVar10,o_test,x86TEST);
  pbVar60 = pbVar60 + iVar10 + iVar11;
  uVar46 = 0xfffffffffffffffb;
  lVar50 = 0;
  pbVar61 = pbVar60;
  do {
    xVar4 = *(x86Reg *)((long)testRegs + lVar50);
    EMIT_OP_REG(&local_c90,o_call,xVar4);
    bVar5 = uVar46 < 4;
    if (bVar5) {
      *pbVar61 = 0x41;
    }
    pbVar61[bVar5] = 0xff;
    pbVar61[(ulong)bVar5 + 1] = regCode[xVar4] | 0xd0;
    pbVar61 = pbVar61 + (int)(bVar5 + 2);
    uVar46 = uVar46 + 1;
    lVar50 = lVar50 + 4;
  } while (lVar50 != 0x24);
  pbVar60 = pbVar60 + ((int)pbVar61 - (int)pbVar60);
  iVar10 = TestRptrEncoding(&local_c90,pbVar60,o_call,x86CALL,2);
  if (stream + 0x200000 <= pbVar60 + iVar10) {
    __assert_fail("stream < buf + bufSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1044,"void x86TestEncoding(unsigned char *)");
  }
  uVar46 = ((long)local_c90.x86Op - (long)start_23 >> 4) * -0x3333333333333333;
  memset(&local_240.ctx,0,0x8c);
  local_240.tempStackArrayBase = (uint *)0x0;
  local_240.tempStackArrayEnd = (uint *)0x0;
  local_240.callInstructionPos = 0;
  memset(&local_240.instAddress,0,0x9a);
  local_240.vsAsmStyle = true;
  local_ed0.outputBuf = local_ed0.outputBufDef;
  local_ed0.outputBufSize = 0x100;
  local_ed0.outputBufPos = 0;
  local_ed0.tempBuf = local_ed0.tempBufDef;
  local_ed0.tempBufSize = 0x100;
  local_ed0.stream = (void *)0x0;
  local_ed0.openStream = OutputContext::FileOpen;
  local_ed0.writeStream = OutputContext::FileWrite;
  local_ed0.closeStream = OutputContext::FileClose;
  local_ed0.stream = fopen("asmX86_test.txt","w");
  uVar63 = (uint)uVar46;
  if (uVar63 != 0) {
    uVar46 = uVar46 & 0xffffffff;
    this = start_23;
    do {
      x86Instruction::Decode(this,&local_240,local_2c8,0x80);
      sVar49 = strlen(local_2c8);
      OutputContext::Print(&local_ed0,local_2c8,(uint)sVar49);
      uVar54 = (ulong)local_ed0.outputBufPos;
      uVar52 = local_ed0.outputBufPos + 1;
      local_ed0.outputBufPos = uVar52;
      local_ed0.outputBuf[uVar54] = '\n';
      if (uVar52 == local_ed0.outputBufSize) {
        (*local_ed0.writeStream)(local_ed0.stream,local_ed0.outputBuf,uVar52);
        local_ed0._264_8_ = local_ed0._264_8_ & 0xffffffff;
      }
      this = this + 1;
      uVar46 = uVar46 - 1;
    } while (uVar46 != 0);
  }
  if (local_ed0.outputBufPos != 0) {
    (*local_ed0.writeStream)(local_ed0.stream,local_ed0.outputBuf,local_ed0.outputBufPos);
  }
  local_ed0._264_8_ = local_ed0._264_8_ & 0xffffffff;
  (*local_ed0.closeStream)(local_ed0.stream);
  local_ed0.stream = (void *)0x0;
  puVar55 = (uchar *)operator_new__(0x200000);
  puVar56 = x86TranslateInstructionList(puVar55,puVar55 + 0x200000,start_23,uVar63,(uchar **)0x0);
  uVar63 = (int)(pbVar60 + iVar10) - local_f98;
  if ((int)puVar56 - (int)puVar55 != uVar63) {
    __assert_fail("unsigned(stream2 - buf2) == unsigned(stream - buf)",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1062,"void x86TestEncoding(unsigned char *)");
  }
  iVar10 = bcmp(stream,puVar55,(ulong)uVar63);
  if (iVar10 != 0) {
    __assert_fail("memcmp(buf, buf2, unsigned(stream - buf)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x1065,"void x86TestEncoding(unsigned char *)");
  }
  OutputContext::~OutputContext(&local_ed0);
  return;
}

Assistant:

void x86TestEncoding(unsigned char *codeLaunchHeader)
{
	(void)codeLaunchHeader;

	// clang takes an extreemely long time to optimize this function
#if !defined(NDEBUG)
	unsigned bufSize = 2048 * 1024;
	unsigned char *buf = new unsigned char[bufSize];

	CodeGenGenericContext ctx;
	unsigned char *stream = buf;

	unsigned instSize = 256 * 1024;
	x86Instruction *instList = new x86Instruction[instSize];
	NULLC::fillMemory(instList, 0, instSize * sizeof(x86Instruction));
	ctx.SetLastInstruction(instList, instList);

	stream += TestRptrXmmEncoding(ctx, stream, o_movss, x86MOVSS, testSizeDword);

	stream += TestXmmXmmEncoding(ctx, stream, o_movsd, x86MOVSD);
	stream += TestRptrXmmEncoding(ctx, stream, o_movsd, x86MOVSD, testSizeQword);
	stream += TestXmmRptrEncoding(ctx, stream, o_movsd, x86MOVSD, testSizeQword);

	stream += TestRegXmmEncoding(ctx, stream, o_movd, x86MOVD);

	stream += TestRegRptrEncoding(ctx, stream, o_movsxd, x86MOVSXD, testSizeDword);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtss2sd, x86CVTSS2SD, testSizeDword);
	stream += TestXmmXmmEncoding(ctx, stream, o_cvtss2sd, x86CVTSS2SD);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtsd2ss, x86CVTSD2SS, testSizeQword);
	stream += TestXmmXmmEncoding(ctx, stream, o_cvtsd2ss, x86CVTSD2SS);

	stream += TestRegRptrEncoding(ctx, stream, o_cvttsd2si, x86CVTTSD2SI, testSizeQword);

	stream += TestRegRptrEncoding(ctx, stream, o_cvttsd2si64, x64CVTTSD2SI, testSizeQword);

	stream += TestXmmRptrEncoding(ctx, stream, o_cvtsi2sd, x86CVTSI2SD, testSizeDword);
	stream += TestXmmRegEncoding(ctx, stream, o_cvtsi2sd, x86CVTSI2SD);
	stream += TestXmmRegEncoding(ctx, stream, o_cvtsi2sd64, x64CVTSI2SD);

	stream += TestXmmXmmEncoding(ctx, stream, o_addsd, x86ADDSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_addsd, x86ADDSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_subsd, x86SUBSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_subsd, x86SUBSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_mulsd, x86MULSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_mulsd, x86MULSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_divsd, x86DIVSD);
	stream += TestXmmRptrEncoding(ctx, stream, o_divsd, x86DIVSD);

	stream += TestXmmXmmEncoding(ctx, stream, o_sqrtsd, x86SQRTSD);

	stream += TestXmmXmmEncoding(ctx, stream, o_cmpeqsd, x86CMPEQSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmpltsd, x86CMPLTSD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmplesd, x86CMPLESD);
	stream += TestXmmXmmEncoding(ctx, stream, o_cmpneqsd, x86CMPNEQSD);

#if defined(_M_X64)
	stream += TestRptrEncoding(ctx, stream, o_push, x86PUSH, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_push, x86PUSH);
	stream += TestNumEncoding(ctx, stream, o_push, x86PUSH);

	stream += TestRptrEncoding(ctx, stream, o_pop, x86POP, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_pop, x86POP);
#else
	stream += TestRptrEncoding(ctx, stream, o_push, x86PUSH, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_push, x86PUSH);
	stream += TestNumEncoding(ctx, stream, o_push, x86PUSH);

	stream += TestRptrEncoding(ctx, stream, o_pop, x86POP, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_pop, x86POP);
#endif

	stream += TestRegNumEncoding(ctx, stream, o_mov, x86MOV);
	stream += TestRegRegEncoding(ctx, stream, o_mov, x86MOV);
	stream += TestRegRptrEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_mov, x86MOV, testSizeDword);

	stream += TestRegNum64Encoding(ctx, stream, o_mov64, x64MOV);
	stream += TestRegRegEncoding(ctx, stream, o_mov64, x64MOV);
	stream += TestRegRptrEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_mov64, x86MOV, testSizeQword);

	//stream += TestRegRptrEncoding(ctx, stream, o_movsx, x86MOVSX);

	stream += TestRegRptrEncoding(ctx, stream, o_lea, x86LEA);

	stream += TestRptrEncoding(ctx, stream, o_neg, x86NEG, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_neg, x86NEG);

	stream += TestRptrEncoding(ctx, stream, o_neg64, x86NEG, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_neg64, x64NEG);

	stream += TestRegRegEncoding(ctx, stream, o_add, x86ADD);
	stream += TestRegNumEncoding(ctx, stream, o_add, x86ADD);
	stream += TestRegRptrEncoding(ctx, stream, o_add, x86ADD, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_add, x86ADD, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_add, x86ADD, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_add64, x64ADD);
	stream += TestRegNumEncoding(ctx, stream, o_add64, x64ADD);
	stream += TestRegRptrEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_add64, x86ADD, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_adc, x86ADC);
	stream += TestRegNumEncoding(ctx, stream, o_adc, x86ADC);
	stream += TestRptrRegEncoding(ctx, stream, o_adc, x86ADC, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_adc, x86ADC, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_sub, x86SUB);
	stream += TestRegNumEncoding(ctx, stream, o_sub, x86SUB);
	stream += TestRptrRegEncoding(ctx, stream, o_sub, x86SUB, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_sub, x86SUB, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_sub64, x64SUB);
	stream += TestRegNumEncoding(ctx, stream, o_sub64, x64SUB);
	stream += TestRptrRegEncoding(ctx, stream, o_sub64, x86SUB, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_sub64, x86SUB, testSizeQword);

	stream += TestRegNumEncoding(ctx, stream, o_sbb, x86SBB);
	stream += TestRegRegEncoding(ctx, stream, o_sbb, x86SBB);
	stream += TestRptrRegEncoding(ctx, stream, o_sbb, x86SBB, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_sbb, x86SBB, testSizeDword);

	stream += TestRegEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegRegEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegNumEncoding(ctx, stream, o_imul, x86IMUL);
	stream += TestRegRptrEncoding(ctx, stream, o_imul, x86IMUL, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_imul64, x64IMUL);
	stream += TestRegRptrEncoding(ctx, stream, o_imul64, x86IMUL, testSizeQword);

	stream += TestRptrEncoding(ctx, stream, o_idiv, x86IDIV, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_idiv, x86IDIV);

	stream += TestRptrEncoding(ctx, stream, o_idiv64, x86IDIV, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_idiv64, x64IDIV);

	stream += TestRegNumEncoding(ctx, stream, o_shl, x86SHL, true);
	stream += TestRptrNumEncoding(ctx, stream, o_shl, x86SHL, testSizeDword);

	stream += TestRegEncoding(ctx, stream, o_sal, x86SAL);
	stream += TestRegNumEncoding(ctx, stream, o_sal, x86SAL, true);

	stream += TestRegEncoding(ctx, stream, o_sal64, x64SAL);
	stream += TestRegNumEncoding(ctx, stream, o_sal64, x64SAL, true);

	stream += TestRegEncoding(ctx, stream, o_sar, x86SAR);
	stream += TestRegNumEncoding(ctx, stream, o_sar, x86SAR, true);

	stream += TestRegEncoding(ctx, stream, o_sar64, x64SAR);
	stream += TestRegNumEncoding(ctx, stream, o_sar64, x64SAR, true);

	stream += TestRptrEncoding(ctx, stream, o_not, x86NOT, testSizeDword);
	stream += TestRegEncoding(ctx, stream, o_not, x86NOT);

	stream += TestRptrEncoding(ctx, stream, o_not64, x86NOT, testSizeQword);
	stream += TestRegEncoding(ctx, stream, o_not64, x64NOT);

	stream += TestRegRegEncoding(ctx, stream, o_and, x86AND);
	stream += TestRegNumEncoding(ctx, stream, o_and, x86AND);
	stream += TestRegRptrEncoding(ctx, stream, o_and, x86AND, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_and, x86AND, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_and, x86AND, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_and64, x64AND);
	stream += TestRegRptrEncoding(ctx, stream, o_and64, x86AND, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_and64, x86AND, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_and64, x86AND, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_or, x86OR);
	stream += TestRegNumEncoding(ctx, stream, o_or, x86OR);
	stream += TestRegRptrEncoding(ctx, stream, o_or, x86OR, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_or, x86OR, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_or, x86OR, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_or64, x64OR);
	stream += TestRegRptrEncoding(ctx, stream, o_or64, x86OR, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_or64, x86OR, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_or64, x86OR, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_xor, x86XOR);
	stream += TestRegNumEncoding(ctx, stream, o_xor, x86XOR);
	stream += TestRegRptrEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_xor, x86XOR, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_xor64, x64XOR);
	stream += TestRegRptrEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_xor64, x86XOR, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_cmp, x86CMP);
	stream += TestRegNumEncoding(ctx, stream, o_cmp, x86CMP);
	stream += TestRegRptrEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);
	stream += TestRptrRegEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);
	stream += TestRptrNumEncoding(ctx, stream, o_cmp, x86CMP, testSizeDword);

	stream += TestRegRegEncoding(ctx, stream, o_cmp64, x64CMP);
	stream += TestRegNumEncoding(ctx, stream, o_cmp64, x64CMP);
	stream += TestRegRptrEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);
	stream += TestRptrRegEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);
	stream += TestRptrNumEncoding(ctx, stream, o_cmp64, x86CMP, testSizeQword);

	stream += TestRegRegEncoding(ctx, stream, o_test, x86TEST);

	stream += TestRegEncoding(ctx, stream, o_call, x86CALL);
	stream += TestRptrEncoding(ctx, stream, o_call, x86CALL, testSizeQword);

	assert(stream < buf + bufSize);

	const unsigned instBufSize = 128;
	char instBuf[instBufSize];

	unsigned instCount = unsigned(ctx.GetLastInstruction() - instList);

	CodeGenRegVmStateContext vmState;

	vmState.vsAsmStyle = true;

	OutputContext output;
	output.stream = output.openStream("asmX86_test.txt");

	for(unsigned i = 0; i < instCount; i++)
	{
		instList[i].Decode(vmState, instBuf, instBufSize);

		output.Print(instBuf);
		output.Print('\n');
	}

	output.Flush();
	output.closeStream(output.stream);
	output.stream = NULL;

	unsigned char *buf2 = new unsigned char[bufSize];

	unsigned char *stream2 = x86TranslateInstructionList(buf2, buf2 + bufSize, instList, instCount, NULL);

	assert(unsigned(stream2 - buf2) == unsigned(stream - buf));
	(void)stream2;

	assert(memcmp(buf, buf2, unsigned(stream - buf)) == 0);

	/*DWORD oldProtect;
	VirtualProtect((void*)buf, unsigned(stream - buf), PAGE_EXECUTE_READWRITE, (DWORD*)&oldProtect);

	uintptr_t regFilePtr[8];

	typedef	uintptr_t(*nullcFunc)(unsigned char *codeStart, uintptr_t *regFilePtr);
	nullcFunc gate = (nullcFunc)(uintptr_t)codeLaunchHeader;
	gate(buf, regFilePtr);*/
#endif
}